

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KryoFlux.cpp
# Opt level: O2

int __thiscall KryoFlux::SelectDensity(KryoFlux *this,bool density)

{
  int iVar1;
  undefined7 in_register_00000031;
  string local_30;
  
  (**(code **)(*(long *)this + 0x18))
            (&local_30,this,8,CONCAT71(in_register_00000031,density) & 0xffffffff,0);
  iVar1 = ResponseCode(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return iVar1;
}

Assistant:

int KryoFlux::SelectDensity(bool density)
{
    return ResponseCode(Control(REQ_DENSITY, density));
}